

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# request.cpp
# Opt level: O2

bool GenerateAuthCookie(string *cookie_out,optional<std::filesystem::perms> cookie_perms)

{
  long lVar1;
  path src;
  char cVar2;
  bool bVar3;
  perms p;
  long in_FS_OFFSET;
  Span<const_unsigned_char> s;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view source_file_03;
  Span<unsigned_char> bytes;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view logging_function_03;
  error_code code;
  undefined1 auStack_348 [24];
  path in_stack_fffffffffffffcd0;
  path local_2f0;
  path filepath;
  path filepath_tmp;
  ofstream file;
  string cookie;
  uchar rand_pwd [32];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bytes.m_size = 0x20;
  bytes.m_data = rand_pwd;
  GetRandBytes(bytes);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file,
                 &COOKIEAUTH_USER_abi_cxx11_,":");
  s.m_size = 0x20;
  s.m_data = rand_pwd;
  HexStr_abi_cxx11_((string *)&filepath_tmp,s);
  std::operator+(&cookie,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&file,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&filepath_tmp)
  ;
  std::__cxx11::string::~string((string *)&filepath_tmp);
  std::__cxx11::string::~string((string *)&file);
  std::ofstream::ofstream(&file);
  GetAuthCookieFile(&filepath_tmp,true);
  std::ofstream::open((char *)&file,
                      (_Ios_Openmode)filepath_tmp.super_path._M_pathname._M_dataplus._M_p);
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 == '\0') {
    std::filesystem::__cxx11::path::string((string *)&filepath,&filepath_tmp.super_path);
    source_file_00._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/request.cpp"
    ;
    source_file_00._M_len = 0x5f;
    logging_function_00._M_str = "GenerateAuthCookie";
    logging_function_00._M_len = 0x12;
    LogPrintFormatInternal<std::__cxx11::string>
              (logging_function_00,source_file_00,0x6f,ALL,Info,(ConstevalFormatString<1U>)0xe37887,
               (string *)&filepath);
    std::__cxx11::string::~string((string *)&filepath);
    bVar3 = false;
    goto LAB_00a95fc2;
  }
  std::operator<<((ostream *)&file,(string *)&cookie);
  std::ofstream::close();
  GetAuthCookieFile(&filepath,false);
  std::filesystem::__cxx11::path::path(&local_2f0,&filepath_tmp.super_path);
  std::filesystem::__cxx11::path::path((path *)&stack0xfffffffffffffce8,&filepath.super_path);
  src.super_path._M_pathname._M_dataplus._M_p._4_4_ = code._4_4_;
  src.super_path._M_pathname._M_dataplus._M_p._0_4_ = code._M_value;
  src.super_path._M_pathname._M_string_length = (size_type)code._M_cat;
  src.super_path._M_pathname.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )auStack_348._0_16_;
  src.super_path._M_cmpts._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
       (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        )(unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
          )auStack_348._16_8_;
  bVar3 = RenameOver(src,(path)in_stack_fffffffffffffcd0);
  std::filesystem::__cxx11::path::~path((path *)&stack0xfffffffffffffce8);
  std::filesystem::__cxx11::path::~path(&local_2f0);
  if (bVar3) {
    if (((ulong)cookie_perms.super__Optional_base<std::filesystem::perms,_true,_true>._M_payload.
                super__Optional_payload_base<std::filesystem::perms> >> 0x20 & 1) != 0) {
      code._M_value = 0;
      code._M_cat = (error_category *)std::_V2::system_category();
      std::filesystem::permissions
                ((path *)&filepath,
                 cookie_perms.super__Optional_base<std::filesystem::perms,_true,_true>._M_payload.
                 super__Optional_payload_base<std::filesystem::perms>._M_payload,replace,&code);
      if (code._M_value != 0) {
        std::filesystem::__cxx11::path::string
                  ((string *)(auStack_348 + 0x10),&filepath_tmp.super_path);
        source_file._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/request.cpp"
        ;
        source_file._M_len = 0x5f;
        logging_function._M_str = "GenerateAuthCookie";
        logging_function._M_len = 0x12;
        LogPrintFormatInternal<std::__cxx11::string>
                  (logging_function,source_file,0x7e,ALL,Info,(ConstevalFormatString<1U>)0xe378f7,
                   (string *)(auStack_348 + 0x10));
        goto LAB_00a95ece;
      }
    }
    g_generated_cookie = 1;
    std::filesystem::__cxx11::path::string((string *)(auStack_348 + 0x10),&filepath.super_path);
    source_file_02._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/request.cpp"
    ;
    source_file_02._M_len = 0x5f;
    logging_function_02._M_str = "GenerateAuthCookie";
    logging_function_02._M_len = 0x12;
    LogPrintFormatInternal<std::__cxx11::string>
              (logging_function_02,source_file_02,0x84,ALL,Info,(ConstevalFormatString<1U>)0xe37933,
               (string *)(auStack_348 + 0x10));
    std::__cxx11::string::~string((string *)(auStack_348 + 0x10));
    std::filesystem::status((path *)&filepath);
    PermsToSymbolicString_abi_cxx11_((string *)(auStack_348 + 0x10),p);
    source_file_03._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/request.cpp"
    ;
    source_file_03._M_len = 0x5f;
    logging_function_03._M_str = "GenerateAuthCookie";
    logging_function_03._M_len = 0x12;
    LogPrintFormatInternal<std::__cxx11::string>
              (logging_function_03,source_file_03,0x85,ALL,Info,(ConstevalFormatString<1U>)0xe3795b,
               (string *)(auStack_348 + 0x10));
    std::__cxx11::string::~string((string *)(auStack_348 + 0x10));
    bVar3 = true;
    if (cookie_out != (string *)0x0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                (cookie_out,&cookie);
    }
  }
  else {
    std::filesystem::__cxx11::path::string((string *)(auStack_348 + 0x10),&filepath_tmp.super_path);
    std::filesystem::__cxx11::path::string((string *)&code,&filepath.super_path);
    source_file_01._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/request.cpp"
    ;
    source_file_01._M_len = 0x5f;
    logging_function_01._M_str = "GenerateAuthCookie";
    logging_function_01._M_len = 0x12;
    LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string>
              (logging_function_01,source_file_01,0x77,ALL,Info,(ConstevalFormatString<2U>)0xe378c1,
               (string *)(auStack_348 + 0x10),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&code);
    std::__cxx11::string::~string((string *)&code);
LAB_00a95ece:
    std::__cxx11::string::~string((string *)(auStack_348 + 0x10));
    bVar3 = false;
  }
  std::filesystem::__cxx11::path::~path(&filepath.super_path);
LAB_00a95fc2:
  std::filesystem::__cxx11::path::~path(&filepath_tmp.super_path);
  std::ofstream::~ofstream(&file);
  std::__cxx11::string::~string((string *)&cookie);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool GenerateAuthCookie(std::string* cookie_out, std::optional<fs::perms> cookie_perms)
{
    const size_t COOKIE_SIZE = 32;
    unsigned char rand_pwd[COOKIE_SIZE];
    GetRandBytes(rand_pwd);
    std::string cookie = COOKIEAUTH_USER + ":" + HexStr(rand_pwd);

    /** the umask determines what permissions are used to create this file -
     * these are set to 0077 in common/system.cpp.
     */
    std::ofstream file;
    fs::path filepath_tmp = GetAuthCookieFile(true);
    file.open(filepath_tmp);
    if (!file.is_open()) {
        LogInfo("Unable to open cookie authentication file %s for writing\n", fs::PathToString(filepath_tmp));
        return false;
    }
    file << cookie;
    file.close();

    fs::path filepath = GetAuthCookieFile(false);
    if (!RenameOver(filepath_tmp, filepath)) {
        LogInfo("Unable to rename cookie authentication file %s to %s\n", fs::PathToString(filepath_tmp), fs::PathToString(filepath));
        return false;
    }
    if (cookie_perms) {
        std::error_code code;
        fs::permissions(filepath, cookie_perms.value(), fs::perm_options::replace, code);
        if (code) {
            LogInfo("Unable to set permissions on cookie authentication file %s\n", fs::PathToString(filepath_tmp));
            return false;
        }
    }

    g_generated_cookie = true;
    LogInfo("Generated RPC authentication cookie %s\n", fs::PathToString(filepath));
    LogInfo("Permissions used for cookie: %s\n", PermsToSymbolicString(fs::status(filepath).permissions()));

    if (cookie_out)
        *cookie_out = cookie;
    return true;
}